

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoSift.c
# Opt level: O0

void reoReorderSift(reo_man *p)

{
  int iVar1;
  double dVar2;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  int local_38;
  int v;
  int c;
  int q;
  int VarCurrent;
  int BestQ;
  double CostBest;
  double CostLimit;
  double CostCurrent;
  reo_man *p_local;
  
  if (p->nSupp < 1) {
    __assert_fail("p->nSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                  ,0x37,"void reoReorderSift(reo_man *)");
  }
  if (p->fMinWidth == 0) {
    if (p->fMinApl == 0) {
      CostLimit = (double)p->nNodesCur;
    }
    else {
      CostLimit = p->nAplCur;
    }
  }
  else {
    CostLimit = (double)p->nWidthCur;
  }
  CostBest = (double)((int)(CostLimit * 1.15) + 1);
  local_38 = 0;
  do {
    if (p->nSupp <= local_38) {
      for (local_3c = 0; local_3c < p->nSupp; local_3c = local_3c + 1) {
        p->pPlanes[local_3c].fSifted = 0;
      }
      return;
    }
    c = -1;
    _VarCurrent = -1.0;
    for (local_3c = 0; local_3c < p->nSupp; local_3c = local_3c + 1) {
      p->pVarCosts[local_3c] = 10000000.0;
      if ((p->pPlanes[local_3c].fSifted == 0) &&
         (_VarCurrent < (double)p->pPlanes[local_3c].statsNodes)) {
        _VarCurrent = (double)p->pPlanes[local_3c].statsNodes;
        c = local_3c;
      }
    }
    if (c == -1) {
      __assert_fail("VarCurrent != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                    ,0x5a,"void reoReorderSift(reo_man *)");
    }
    p->pPlanes[c].fSifted = 1;
    p->pVarCosts[c] = CostLimit;
    _VarCurrent = CostLimit;
    q = c;
    if (c < p->nSupp / 2) {
      p->pPlanes->statsCostAbove = 0.0;
      for (local_3c = 1; local_3c <= c; local_3c = local_3c + 1) {
        p->pPlanes[local_3c].statsCostAbove =
             p->pPlanes[local_3c + -1].statsCostAbove + p->pPlanes[local_3c + -1].statsCost;
      }
      p->pPlanes[p->nSupp].statsCostBelow = 0.0;
      iVar1 = p->nSupp;
      while (local_3c = iVar1 + -1, c <= local_3c) {
        p->pPlanes[local_3c].statsCostBelow =
             p->pPlanes[iVar1].statsCostBelow + p->pPlanes[iVar1].statsCost;
        iVar1 = local_3c;
      }
      dVar2 = p->pPlanes[c].statsCostAbove + p->pPlanes[c].statsCost + p->pPlanes[c].statsCostBelow;
      if ((CostLimit != dVar2) || (NAN(CostLimit) || NAN(dVar2))) {
        __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0x76,"void reoReorderSift(reo_man *)");
      }
      while (v = c + -1, -1 < v) {
        dVar2 = reoReorderSwapAdjacentVars(p,v,1);
        CostLimit = CostLimit - dVar2;
        p->pVarCosts[v] = CostLimit;
        p->pPlanes[v].statsCostBelow = p->pPlanes[c].statsCostBelow + p->pPlanes[c].statsCost;
        if ((CostBest <= CostLimit) ||
           (_VarCurrent <= p->pPlanes[v].statsCostBelow + (p->pPlanes[v].statsCostAbove * 2.0) / 3.0
           )) break;
        if (CostLimit < _VarCurrent) {
          q = v;
          if (CostBest <= (double)((int)(CostLimit * 1.15) + 1)) {
            local_48 = CostBest;
          }
          else {
            local_48 = (double)((int)(CostLimit * 1.15) + 1);
          }
          CostBest = local_48;
          _VarCurrent = CostLimit;
        }
        c = v;
        if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
           (SBORROW4(p->nNodesCur,p->nNodesMaxAlloc * 2) ==
            p->nNodesCur + p->nNodesMaxAlloc * -2 < 0)) {
          reoResizeStructures(p,0,p->nNodesCur,0);
        }
      }
      if (v == -1) {
        v = c;
      }
      while (v < p->nSupp + -1) {
        dVar2 = reoReorderSwapAdjacentVars(p,v,0);
        CostLimit = CostLimit - dVar2;
        iVar1 = v + 1;
        if (((p->pVarCosts[iVar1] != 10000000.0) || (NAN(p->pVarCosts[iVar1]))) &&
           (1e-07 < ABS(p->pVarCosts[iVar1] - CostLimit))) {
          printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
        }
        p->pVarCosts[iVar1] = CostLimit;
        p->pPlanes[iVar1].statsCostAbove = p->pPlanes[v].statsCostAbove + p->pPlanes[v].statsCost;
        v = iVar1;
        if ((q <= iVar1) &&
           ((CostBest <= CostLimit ||
            (_VarCurrent <=
             p->pPlanes[iVar1].statsCostAbove + (p->pPlanes[iVar1].statsCostBelow * 2.0) / 3.0))))
        break;
        if (CostLimit <= _VarCurrent) {
          if (CostBest <= (double)((int)(CostLimit * 1.15) + 1)) {
            local_50 = CostBest;
          }
          else {
            local_50 = (double)((int)(CostLimit * 1.15) + 1);
          }
          CostBest = local_50;
          q = iVar1;
          _VarCurrent = CostLimit;
        }
        if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
           (SBORROW4(p->nNodesCur,p->nNodesMaxAlloc * 2) ==
            p->nNodesCur + p->nNodesMaxAlloc * -2 < 0)) {
          reoResizeStructures(p,0,p->nNodesCur,0);
        }
      }
      if (v < q) {
        __assert_fail("q >= BestQ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0xcb,"void reoReorderSift(reo_man *)");
      }
      for (; q < v; v = v + -1) {
        dVar2 = reoReorderSwapAdjacentVars(p,v + -1,1);
        CostLimit = CostLimit - dVar2;
        if (1e-07 < ABS(p->pVarCosts[v + -1] - CostLimit)) {
          printf("reoReorderSift():  Error! On the return move, the costs are different.\n");
          fflush(_stdout);
        }
      }
    }
    else {
      p->pPlanes->statsCostAbove = 0.0;
      for (local_3c = 1; local_3c <= c; local_3c = local_3c + 1) {
        p->pPlanes[local_3c].statsCostAbove =
             p->pPlanes[local_3c + -1].statsCostAbove + p->pPlanes[local_3c + -1].statsCost;
      }
      p->pPlanes[p->nSupp].statsCostBelow = 0.0;
      iVar1 = p->nSupp;
      while (local_3c = iVar1 + -1, c <= local_3c) {
        p->pPlanes[local_3c].statsCostBelow =
             p->pPlanes[iVar1].statsCostBelow + p->pPlanes[iVar1].statsCost;
        iVar1 = local_3c;
      }
      dVar2 = p->pPlanes[c].statsCostAbove + p->pPlanes[c].statsCost + p->pPlanes[c].statsCostBelow;
      if ((CostLimit != dVar2) || (NAN(CostLimit) || NAN(dVar2))) {
        __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0xe4,"void reoReorderSift(reo_man *)");
      }
      v = c;
      while (iVar1 = v, v < p->nSupp + -1) {
        dVar2 = reoReorderSwapAdjacentVars(p,v,0);
        CostLimit = CostLimit - dVar2;
        iVar1 = v + 1;
        p->pVarCosts[iVar1] = CostLimit;
        p->pPlanes[iVar1].statsCostAbove = p->pPlanes[v].statsCostAbove + p->pPlanes[v].statsCost;
        if ((CostBest <= CostLimit) ||
           (_VarCurrent <=
            p->pPlanes[iVar1].statsCostAbove + (p->pPlanes[iVar1].statsCostBelow * 2.0) / 3.0))
        break;
        if (CostLimit < _VarCurrent) {
          if (CostBest <= (double)((int)(CostLimit * 1.15) + 1)) {
            local_58 = CostBest;
          }
          else {
            local_58 = (double)((int)(CostLimit * 1.15) + 1);
          }
          CostBest = local_58;
          q = iVar1;
          _VarCurrent = CostLimit;
        }
        v = iVar1;
        if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
           (SBORROW4(p->nNodesCur,p->nNodesMaxAlloc * 2) ==
            p->nNodesCur + p->nNodesMaxAlloc * -2 < 0)) {
          reoResizeStructures(p,0,p->nNodesCur,0);
        }
      }
LAB_00aa1aad:
      v = iVar1 + -1;
      if (-1 < v) {
        dVar2 = reoReorderSwapAdjacentVars(p,v,1);
        CostLimit = CostLimit - dVar2;
        if (((p->pVarCosts[v] != 10000000.0) || (NAN(p->pVarCosts[v]))) &&
           (1e-07 < ABS(p->pVarCosts[v] - CostLimit))) {
          printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
        }
        p->pVarCosts[v] = CostLimit;
        p->pPlanes[v].statsCostBelow =
             p->pPlanes[iVar1].statsCostBelow + p->pPlanes[iVar1].statsCost;
        if ((v <= q) &&
           ((CostBest <= CostLimit ||
            (_VarCurrent <=
             p->pPlanes[v].statsCostBelow + (p->pPlanes[v].statsCostAbove * 2.0) / 3.0))))
        goto LAB_00aa1ce1;
        if (CostLimit <= _VarCurrent) {
          q = v;
          if (CostBest <= (double)((int)(CostLimit * 1.15) + 1)) {
            local_60 = CostBest;
          }
          else {
            local_60 = (double)((int)(CostLimit * 1.15) + 1);
          }
          CostBest = local_60;
          _VarCurrent = CostLimit;
        }
        iVar1 = v;
        if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
           (SBORROW4(p->nNodesCur,p->nNodesMaxAlloc * 2) ==
            p->nNodesCur + p->nNodesMaxAlloc * -2 < 0)) {
          reoResizeStructures(p,0,p->nNodesCur,0);
        }
        goto LAB_00aa1aad;
      }
LAB_00aa1ce1:
      if (v == -1) {
        v = iVar1;
      }
      if (q < v) {
        __assert_fail("q <= BestQ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0x139,"void reoReorderSift(reo_man *)");
      }
      for (; v < q; v = v + 1) {
        dVar2 = reoReorderSwapAdjacentVars(p,v,0);
        CostLimit = CostLimit - dVar2;
        if (1e-07 < ABS(p->pVarCosts[v + 1] - CostLimit)) {
          printf("reoReorderSift(): Error! On the return move, the costs are different.\n");
          fflush(_stdout);
        }
      }
    }
    if (1e-07 <= ABS(_VarCurrent - CostLimit)) {
      __assert_fail("fabs( CostBest - CostCurrent ) < REO_COST_EPSILON",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                    ,0x145,"void reoReorderSift(reo_man *)");
    }
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        p->nNodesCur = (int)_VarCurrent;
      }
      else {
        p->nAplCur = CostLimit;
      }
    }
    else {
      p->nWidthCur = (int)_VarCurrent;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the variable sifting algorithm.]

  Description [Performs a sequence of adjacent variable swaps known as "sifting".
  Uses the cost functions determined by the flag.]

  SideEffects []

  SeeAlso     []

***********************************************************************/
void reoReorderSift( reo_man * p )
{
    double CostCurrent;  // the cost of the current permutation
    double CostLimit;    // the maximum increase in cost that can be tolerated
    double CostBest;     // the best cost
    int BestQ;           // the best position
    int VarCurrent;      // the current variable to move   
    int q;               // denotes the current position of the variable
    int c;               // performs the loops over variables until all of them are sifted
    int v;               // used for other purposes

    assert( p->nSupp > 0 );

    // set the current cost depending on the minimization criteria
    if ( p->fMinWidth )
        CostCurrent = p->nWidthCur;
    else if ( p->fMinApl )
        CostCurrent = p->nAplCur;
    else
        CostCurrent = p->nNodesCur;

    // find the upper bound on tbe cost growth
    CostLimit = 1 + (int)(REO_REORDER_LIMIT * CostCurrent);

    // perform sifting for each of p->nSupp variables
    for ( c = 0; c < p->nSupp; c++ )
    {
        // select the current variable to be the one with the largest number of nodes that is not sifted yet
        VarCurrent = -1;
        CostBest   = -1.0;
        for ( v = 0; v < p->nSupp; v++ )
        {
            p->pVarCosts[v] = REO_HIGH_VALUE;
            if ( !p->pPlanes[v].fSifted )
            {
//                VarCurrent = v;
//                if ( CostBest < p->pPlanes[v].statsCost )
                if ( CostBest < p->pPlanes[v].statsNodes )
                {
//                    CostBest   = p->pPlanes[v].statsCost;
                    CostBest   = p->pPlanes[v].statsNodes;
                    VarCurrent = v;
                }

            }
        }
        assert( VarCurrent != -1 );
        // mark this variable as sifted
        p->pPlanes[VarCurrent].fSifted = 1;

        // set the current value
        p->pVarCosts[VarCurrent] = CostCurrent;

        // set the best cost
        CostBest = CostCurrent;
        BestQ    = VarCurrent; 

        // determine which way to move the variable first (up or down)
        // the rationale is that if we move the shorter way first
        // it is more likely that the best position will be found on the longer way
        // and the reverse movement (to take the best position) will be faster
        if ( VarCurrent < p->nSupp/2 ) // move up first, then down
        {
            // set the total cost on all levels above the current level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the total cost on all levels below the current level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;

            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move up
            for ( q = VarCurrent-1; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now p points to the position of this var in the order

            // move down
            for ( ; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q >= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // move the variable up from the given position (q) to the best position (BestQ)
            assert( q >= BestQ );
            for ( ; q > BestQ; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q-1, 1 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q-1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift():  Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        else // move down first, then up
        {
            // set the current number of nodes on all levels above the given level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the current number of nodes on all levels below the given level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;
            
            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move down
            for ( q = VarCurrent; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }

            // move up
            for ( --q; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q <= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now q points to the position of this var in the order
            // move the variable down from the given position (q) to the best position (BestQ)
            assert( q <= BestQ );
            for ( ; q < BestQ; q++ )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q+1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift(): Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        assert( fabs( CostBest - CostCurrent ) < REO_COST_EPSILON );

        // update the cost 
        if ( p->fMinWidth )
            p->nWidthCur = (int)CostBest;
        else if ( p->fMinApl )
            p->nAplCur = CostCurrent;
        else
            p->nNodesCur = (int)CostBest;
    }

    // remove the sifted attributes if any
    for ( v = 0; v < p->nSupp; v++ )
        p->pPlanes[v].fSifted = 0;
}